

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int map_extend(wally_map *dst,wally_map *src,_func_int_uchar_ptr_size_t *check_fn)

{
  wally_map_item *pwVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  if (src == (wally_map *)0x0) {
    iVar2 = 0;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    lVar3 = 0x18;
    do {
      uVar4 = uVar4 + 1;
      if (src->num_items <= uVar4) {
        return 0;
      }
      pwVar1 = src->items;
      iVar2 = map_add(dst,*(uchar **)((long)pwVar1 + lVar3 + -0x18),
                      *(size_t *)((long)pwVar1 + lVar3 + -0x10),
                      *(uchar **)((long)pwVar1 + lVar3 + -8),*(size_t *)((long)&pwVar1->key + lVar3)
                      ,false,check_fn,true);
      lVar3 = lVar3 + 0x20;
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

static int map_extend(struct wally_map *dst, const struct wally_map *src,
                      int (*check_fn)(const unsigned char *key, size_t key_len))
{
    int ret = WALLY_OK;
    size_t i;

    if (src) {
        for (i = 0; ret == WALLY_OK && i < src->num_items; ++i)
            ret = map_add(dst, src->items[i].key, src->items[i].key_len,
                          src->items[i].value, src->items[i].value_len,
                          false, check_fn, true);
    }
    return ret;
}